

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O2

void __thiscall kiste::line_data_t::enforce_trailing_text_segment(line_data_t *this)

{
  allocator<char> local_41;
  undefined1 local_40 [48];
  
  enforce_at_least_one_segment(this);
  if ((this->_segments).super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1]._type != text) {
    local_40._0_8_ = 0;
    local_40._8_4_ = text;
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_40 + 0x10),"",&local_41);
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::emplace_back<kiste::segment_t>
              (&this->_segments,(segment_t *)local_40);
    std::__cxx11::string::~string((string *)(local_40 + 0x10));
  }
  return;
}

Assistant:

auto line_data_t::enforce_trailing_text_segment() -> void
  {
    enforce_at_least_one_segment();
    if (_segments.back()._type != segment_type::text)
    {
      _segments.push_back({0, segment_type::text, ""});
    }
  }